

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.hpp
# Opt level: O2

void __thiscall helics::apps::AsioBrokerServer::~AsioBrokerServer(AsioBrokerServer *this)

{
  ~AsioBrokerServer(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

explicit AsioBrokerServer(std::string_view server_name): name_(server_name) {}